

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

IntVect __thiscall amrex::Box::size(Box *this)

{
  int *in_RDI;
  IntVect IVar1;
  IntVect local_68;
  undefined4 local_5c;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  undefined4 local_c;
  int *local_8;
  int iVar2;
  
  local_48 = in_RDI + 3;
  local_c = 0;
  local_1c = 0;
  local_2c = 1;
  local_3c = 1;
  local_4c = 2;
  local_5c = 2;
  local_28 = local_48;
  local_8 = local_48;
  IntVect::IntVect(&local_68,(*local_48 - *in_RDI) + 1,(in_RDI[4] - in_RDI[1]) + 1,
                   (in_RDI[5] - in_RDI[2]) + 1);
  IVar1.vect[0] = local_68.vect[0];
  IVar1.vect[1] = local_68.vect[1];
  register0x00000010 = local_68.vect[2];
  return (IntVect)IVar1.vect;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    IntVect size () const noexcept
    {
        return IntVect(AMREX_D_DECL(bigend[0]-smallend[0] + 1,
                                    bigend[1]-smallend[1] + 1,
                                    bigend[2]-smallend[2] + 1));
    }